

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

int run_test_tcp_open_twice(void)

{
  uv_stream_t *puVar1;
  uv_os_sock_t uVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  undefined8 uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  int iVar8;
  long *plVar9;
  uv_connect_cb p_Var10;
  code *pcVar11;
  long *plVar12;
  uv_shutdown_t *puVar13;
  undefined1 *puVar14;
  uv_connect_t *puVar15;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t client;
  long alStack_3b8 [2];
  undefined1 auStack_3a8 [16];
  code *pcStack_398;
  void *pvStack_390;
  undefined1 auStack_388 [64];
  void *pvStack_348;
  uv_connect_cb ap_Stack_340 [2];
  uv__queue *puStack_330;
  uv__queue *puStack_328;
  code *pcStack_320;
  long lStack_310;
  long lStack_308;
  undefined1 auStack_300 [16];
  sockaddr sStack_2f0;
  long alStack_2e0 [27];
  code *pcStack_208;
  long lStack_1f8;
  long lStack_1f0;
  sockaddr sStack_1e8;
  long alStack_1d8 [27];
  code *pcStack_100;
  long local_f8;
  long local_f0;
  undefined1 local_e8 [216];
  
  pcStack_100 = (code *)0x1cce45;
  uVar2 = create_tcp_socket();
  pcStack_100 = (code *)0x1cce4c;
  uVar3 = create_tcp_socket();
  uVar6 = (ulong)uVar3;
  pcStack_100 = (code *)0x1cce53;
  uVar5 = uv_default_loop();
  pcStack_100 = (code *)0x1cce60;
  iVar4 = uv_tcp_init(uVar5,local_e8);
  local_f0 = (long)iVar4;
  local_f8 = 0;
  if (local_f0 == 0) {
    pcStack_100 = (code *)0x1cce8a;
    iVar4 = uv_tcp_open(local_e8,uVar2);
    local_f0 = (long)iVar4;
    local_f8 = 0;
    if (local_f0 != 0) goto LAB_001ccf7a;
    pcStack_100 = (code *)0x1cceb4;
    iVar4 = uv_tcp_open(local_e8,uVar3);
    local_f0 = (long)iVar4;
    local_f8 = -0x10;
    if (local_f0 != -0x10) goto LAB_001ccf87;
    pcStack_100 = (code *)0x1cced9;
    iVar4 = close(uVar3);
    local_f0 = (long)iVar4;
    local_f8 = 0;
    if (local_f0 != 0) goto LAB_001ccf94;
    pcStack_100 = (code *)0x1ccf03;
    uv_close(local_e8,0);
    pcStack_100 = (code *)0x1ccf08;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x1ccf12;
    uv_run(uVar5,0);
    pcStack_100 = (code *)0x1ccf17;
    uVar6 = uv_default_loop();
    pcStack_100 = (code *)0x1ccf2b;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_100 = (code *)0x1ccf35;
    uv_run(uVar6,0);
    local_f0 = 0;
    pcStack_100 = (code *)0x1ccf43;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x1ccf4b;
    iVar4 = uv_loop_close(uVar5);
    local_f8 = (long)iVar4;
    if (local_f0 == local_f8) {
      pcStack_100 = (code *)0x1ccf61;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x1ccf7a;
    run_test_tcp_open_twice_cold_1();
LAB_001ccf7a:
    pcStack_100 = (code *)0x1ccf87;
    run_test_tcp_open_twice_cold_2();
LAB_001ccf87:
    pcStack_100 = (code *)0x1ccf94;
    run_test_tcp_open_twice_cold_3();
LAB_001ccf94:
    pcStack_100 = (code *)0x1ccfa1;
    run_test_tcp_open_twice_cold_4();
  }
  pcStack_100 = run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  pcStack_208 = (code *)0x1ccfbb;
  pcStack_100 = (code *)uVar6;
  uVar3 = create_tcp_socket();
  pvVar7 = (void *)(ulong)uVar3;
  pcStack_208 = (code *)0x1ccfd3;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1e8);
  alStack_1d8[0] = (long)iVar4;
  lStack_1f8 = 0;
  if (alStack_1d8[0] == 0) {
    pcStack_208 = (code *)0x1ccff8;
    uVar5 = uv_default_loop();
    pcStack_208 = (code *)0x1cd005;
    iVar4 = uv_tcp_init(uVar5,alStack_1d8);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd11e;
    pcStack_208 = (code *)0x1cd036;
    iVar4 = bind(uVar3,&sStack_1e8,0x10);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd12d;
    pcStack_208 = (code *)0x1cd062;
    iVar4 = uv_tcp_open(alStack_1d8,uVar3);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd13c;
    pcStack_208 = (code *)0x1cd093;
    iVar4 = uv_listen(alStack_1d8,0x80,0);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd14b;
    pcStack_208 = (code *)0x1cd0b8;
    pvVar7 = (void *)uv_default_loop();
    pcStack_208 = (code *)0x1cd0cc;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_208 = (code *)0x1cd0d6;
    uv_run(pvVar7,0);
    lStack_1f8 = 0;
    pcStack_208 = (code *)0x1cd0e4;
    uVar5 = uv_default_loop();
    pcStack_208 = (code *)0x1cd0ec;
    iVar4 = uv_loop_close(uVar5);
    lStack_1f0 = (long)iVar4;
    if (lStack_1f8 == lStack_1f0) {
      pcStack_208 = (code *)0x1cd104;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_208 = (code *)0x1cd11e;
    run_test_tcp_open_bound_cold_1();
LAB_001cd11e:
    pcStack_208 = (code *)0x1cd12d;
    run_test_tcp_open_bound_cold_2();
LAB_001cd12d:
    pcStack_208 = (code *)0x1cd13c;
    run_test_tcp_open_bound_cold_3();
LAB_001cd13c:
    pcStack_208 = (code *)0x1cd14b;
    run_test_tcp_open_bound_cold_4();
LAB_001cd14b:
    pcStack_208 = (code *)0x1cd15a;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_208 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_320 = (code *)0x1cd182;
  pcStack_208 = (code *)pvVar7;
  auStack_300 = uv_buf_init("PING",4);
  pcStack_320 = (code *)0x1cd1a2;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2f0);
  alStack_2e0[0] = (long)iVar4;
  lStack_310 = 0;
  if (alStack_2e0[0] == 0) {
    pcStack_320 = (code *)0x1cd1c7;
    uVar3 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar3;
    pcStack_320 = (code *)0x1cd1da;
    iVar4 = connect(uVar3,&sStack_2f0,0x10);
    alStack_2e0[0] = (long)iVar4;
    lStack_310 = 0;
    if (alStack_2e0[0] != 0) goto LAB_001cd3f7;
    pcStack_320 = (code *)0x1cd1ff;
    uVar5 = uv_default_loop();
    pcStack_320 = (code *)0x1cd20c;
    iVar4 = uv_tcp_init(uVar5,alStack_2e0);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd406;
    pcStack_320 = (code *)0x1cd238;
    iVar4 = uv_tcp_open(alStack_2e0,uVar3);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd415;
    pcStack_320 = (code *)0x1cd27a;
    iVar4 = uv_write(&write_req,alStack_2e0,auStack_300,1,write_cb);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd424;
    pcStack_320 = (code *)0x1cd2b2;
    iVar4 = uv_shutdown(&shutdown_req,alStack_2e0,shutdown_cb);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd433;
    pcStack_320 = (code *)0x1cd2ea;
    iVar4 = uv_read_start(alStack_2e0,alloc_cb,read_cb);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd442;
    pcStack_320 = (code *)0x1cd30f;
    uVar5 = uv_default_loop();
    pcStack_320 = (code *)0x1cd319;
    uv_run(uVar5,0);
    lStack_310 = 1;
    lStack_308 = (long)shutdown_cb_called;
    if (lStack_308 != 1) goto LAB_001cd451;
    lStack_310 = 1;
    lStack_308 = (long)write_cb_called;
    if (lStack_308 != 1) goto LAB_001cd460;
    lStack_310 = 1;
    lStack_308 = (long)close_cb_called;
    if (lStack_308 != 1) goto LAB_001cd46f;
    pcStack_320 = (code *)0x1cd38d;
    pvVar7 = (void *)uv_default_loop();
    pcStack_320 = (code *)0x1cd3a1;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_320 = (code *)0x1cd3ab;
    uv_run(pvVar7,0);
    lStack_310 = 0;
    pcStack_320 = (code *)0x1cd3b9;
    uVar5 = uv_default_loop();
    pcStack_320 = (code *)0x1cd3c1;
    iVar4 = uv_loop_close(uVar5);
    lStack_308 = (long)iVar4;
    if (lStack_310 == lStack_308) {
      pcStack_320 = (code *)0x1cd3dd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_320 = (code *)0x1cd3f7;
    run_test_tcp_open_connected_cold_1();
LAB_001cd3f7:
    pcStack_320 = (code *)0x1cd406;
    run_test_tcp_open_connected_cold_2();
LAB_001cd406:
    pcStack_320 = (code *)0x1cd415;
    run_test_tcp_open_connected_cold_3();
LAB_001cd415:
    pcStack_320 = (code *)0x1cd424;
    run_test_tcp_open_connected_cold_4();
LAB_001cd424:
    pcStack_320 = (code *)0x1cd433;
    run_test_tcp_open_connected_cold_5();
LAB_001cd433:
    pcStack_320 = (code *)0x1cd442;
    run_test_tcp_open_connected_cold_6();
LAB_001cd442:
    pcStack_320 = (code *)0x1cd451;
    run_test_tcp_open_connected_cold_7();
LAB_001cd451:
    pcStack_320 = (code *)0x1cd460;
    run_test_tcp_open_connected_cold_8();
LAB_001cd460:
    pcStack_320 = (code *)0x1cd46f;
    run_test_tcp_open_connected_cold_9();
LAB_001cd46f:
    pcStack_320 = (code *)0x1cd47e;
    run_test_tcp_open_connected_cold_10();
  }
  plVar12 = &lStack_310;
  plVar9 = &lStack_308;
  pcStack_320 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if (plVar12 == (long *)0x0) {
    puStack_328 = (uv__queue *)0x1cd4a4;
    write_cb_cold_2();
  }
  else if ((int)plVar9 == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  iVar4 = (int)plVar9;
  puVar13 = (uv_shutdown_t *)((ulong)plVar9 & 0xffffffff);
  puStack_328 = (uv__queue *)shutdown_cb;
  write_cb_cold_1();
  if (puVar13 == &shutdown_req) {
    puStack_328 = (uv__queue *)(long)iVar4;
    puStack_330 = (uv__queue *)0x0;
    if (puStack_328 == (uv__queue *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar4;
    }
  }
  else {
    ap_Stack_340[0] = (uv_connect_cb)0x1cd4e8;
    shutdown_cb_cold_1();
  }
  p_Var10 = (uv_connect_cb)(auStack_388 + 0x58);
  ap_Stack_340[0] = alloc_cb;
  shutdown_cb_cold_2();
  pvStack_348 = (void *)0x10000;
  if ((long)p_Var10 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x37fb20;
  }
  puVar14 = auStack_388 + 0x48;
  pcVar11 = (code *)(auStack_388 + 0x40);
  auStack_388._48_8_ = read_cb;
  ap_Stack_340[0] = p_Var10;
  alloc_cb_cold_1();
  if (puVar14 == (undefined1 *)0x0) {
    auStack_388._24_8_ = (void *)0x1cd5c8;
    read_cb_cold_4();
LAB_001cd5c8:
    auStack_388._24_8_ = (void *)0x1cd5d7;
    read_cb_cold_2();
LAB_001cd5d7:
    auStack_388._24_8_ = (void *)0x1cd5e6;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)pcVar11) {
      auStack_388._48_8_ = (code *)0x4;
      auStack_388._40_8_ = pcVar11;
      if (pcVar11 != (code *)0x4) goto LAB_001cd5c8;
      auStack_388._24_8_ = (void *)0x1cd578;
      iVar4 = memcmp("PING",(void *)*extraout_RDX_00,4);
      auStack_388._48_8_ = SEXT48(iVar4);
      auStack_388._40_8_ = (code *)0x0;
      if ((code *)auStack_388._48_8_ == (code *)0x0) {
        return iVar4;
      }
      goto LAB_001cd5d7;
    }
    auStack_388._40_8_ = (code *)0xfffffffffffff001;
    auStack_388._48_8_ = pcVar11;
    if (pcVar11 == (code *)0xfffffffffffff001) {
      iVar4 = uv_close();
      return iVar4;
    }
  }
  auStack_388._24_8_ = run_test_tcp_write_ready;
  read_cb_cold_1();
  iVar8 = (int)&pvStack_390;
  pcStack_398 = (code *)0x1cd610;
  auStack_388._24_8_ = pvVar7;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_388 + 8);
  auStack_388._0_8_ = SEXT48(iVar4);
  pvStack_390 = (void *)0x0;
  if ((void *)auStack_388._0_8_ == (void *)0x0) {
    pcStack_398 = (code *)0x1cd633;
    uVar3 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar3;
    pcStack_398 = (code *)0x1cd63a;
    uVar5 = uv_default_loop();
    pcStack_398 = (code *)0x1cd649;
    iVar4 = uv_tcp_init(uVar5,&::client);
    auStack_388._0_8_ = SEXT48(iVar4);
    pvStack_390 = (void *)0x0;
    if ((void *)auStack_388._0_8_ != (void *)0x0) goto LAB_001cd7f6;
    pcStack_398 = (code *)0x1cd675;
    iVar4 = uv_tcp_open(&::client,uVar3);
    auStack_388._0_8_ = SEXT48(iVar4);
    pvStack_390 = (void *)0x0;
    if ((void *)auStack_388._0_8_ != (void *)0x0) goto LAB_001cd803;
    pcStack_398 = (code *)0x1cd6b2;
    iVar4 = uv_tcp_connect(&connect_req,&::client,auStack_388 + 8,connect1_cb);
    auStack_388._0_8_ = SEXT48(iVar4);
    pvStack_390 = (void *)0x0;
    if ((void *)auStack_388._0_8_ != (void *)0x0) goto LAB_001cd810;
    pcStack_398 = (code *)0x1cd6d5;
    uVar5 = uv_default_loop();
    pcStack_398 = (code *)0x1cd6df;
    uv_run(uVar5,0);
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)shutdown_cb_called;
    if (pvStack_390 != (void *)0x1) goto LAB_001cd81d;
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)shutdown_requested;
    if (pvStack_390 != (void *)0x1) goto LAB_001cd82a;
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)connect_cb_called;
    if (pvStack_390 != (void *)0x1) goto LAB_001cd837;
    auStack_388._0_8_ = SEXT48(write_cb_called);
    pvStack_390 = (void *)0x0;
    if ((long)auStack_388._0_8_ < 1) goto LAB_001cd844;
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)close_cb_called;
    if (pvStack_390 != (void *)0x1) goto LAB_001cd851;
    pcStack_398 = (code *)0x1cd793;
    pvVar7 = (void *)uv_default_loop();
    pcStack_398 = (code *)0x1cd7a7;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_398 = (code *)0x1cd7b1;
    uv_run(pvVar7,0);
    auStack_388._0_8_ = (void *)0x0;
    pcStack_398 = (code *)0x1cd7bf;
    uVar5 = uv_default_loop();
    pcStack_398 = (code *)0x1cd7c7;
    iVar4 = uv_loop_close(uVar5);
    pvStack_390 = (void *)(long)iVar4;
    if ((void *)auStack_388._0_8_ == pvStack_390) {
      pcStack_398 = (code *)0x1cd7e1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_398 = (code *)0x1cd7f6;
    run_test_tcp_write_ready_cold_1();
LAB_001cd7f6:
    pcStack_398 = (code *)0x1cd803;
    run_test_tcp_write_ready_cold_2();
LAB_001cd803:
    pcStack_398 = (code *)0x1cd810;
    run_test_tcp_write_ready_cold_3();
LAB_001cd810:
    pcStack_398 = (code *)0x1cd81d;
    run_test_tcp_write_ready_cold_4();
LAB_001cd81d:
    pcStack_398 = (code *)0x1cd82a;
    run_test_tcp_write_ready_cold_5();
LAB_001cd82a:
    pcStack_398 = (code *)0x1cd837;
    run_test_tcp_write_ready_cold_6();
LAB_001cd837:
    pcStack_398 = (code *)0x1cd844;
    run_test_tcp_write_ready_cold_7();
LAB_001cd844:
    pcStack_398 = (code *)0x1cd851;
    run_test_tcp_write_ready_cold_8();
LAB_001cd851:
    pcStack_398 = (code *)0x1cd85e;
    run_test_tcp_write_ready_cold_9();
  }
  puVar15 = (uv_connect_t *)auStack_388;
  pcStack_398 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar1 = connect_req.handle;
  plVar12 = alStack_3b8;
  pcStack_398 = (code *)pvVar7;
  if (puVar15 == &connect_req) {
    auStack_3a8._0_8_ = SEXT48(iVar8);
    alStack_3b8[0] = 0;
    if (auStack_3a8._0_8_ != 0) goto LAB_001cd9a6;
    connect_cb_called = connect_cb_called + 1;
    uVar5 = uv_default_loop();
    iVar4 = uv_timer_init(uVar5,&tm);
    auStack_3a8._0_8_ = SEXT48(iVar4);
    alStack_3b8[0] = 0;
    if (auStack_3a8._0_8_ != 0) goto LAB_001cd9b3;
    iVar4 = uv_timer_start(&tm,timer_cb,2000,0);
    auStack_3a8._0_8_ = SEXT48(iVar4);
    alStack_3b8[0] = 0;
    if (auStack_3a8._0_8_ != 0) goto LAB_001cd9c0;
    auStack_3a8 = uv_buf_init("P",1);
    iVar4 = uv_write(&write_req,puVar1,auStack_3a8,1,write1_cb);
    alStack_3b8[0] = (long)iVar4;
    alStack_3b8[1] = 0;
    if (alStack_3b8[0] == 0) {
      iVar4 = uv_read_start(puVar1,alloc_cb,read1_cb);
      alStack_3b8[0] = (long)iVar4;
      alStack_3b8[1] = 0;
      if (alStack_3b8[0] == 0) {
        return iVar4;
      }
      goto LAB_001cd9da;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001cd9a6:
    connect1_cb_cold_2();
LAB_001cd9b3:
    connect1_cb_cold_3();
LAB_001cd9c0:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001cd9da:
  connect1_cb_cold_6();
  iVar4 = uv_is_closing();
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = uv_close(plVar12,0);
  return iVar4;
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock1);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock2);
  ASSERT_EQ(r, UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}